

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPAT.cpp
# Opt level: O1

void __thiscall OpenMD::NPAT::NPAT(NPAT *this,SimInfo *info)

{
  Globals *pGVar1;
  pointer pcVar2;
  int iVar3;
  uint uVar4;
  long *local_48 [2];
  long local_38 [2];
  
  NPT::NPT(&this->super_NPT,info);
  (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator =
       (_func_int **)&PTR__NPAT_002fef68;
  memset(&this->eta,0,0x120);
  pGVar1 = ((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.info_)->simParams_;
  pcVar2 = (pGVar1->PrivilegedAxis).data_._M_dataplus._M_p;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,pcVar2,pcVar2 + (pGVar1->PrivilegedAxis).data_._M_string_length);
  iVar3 = std::__cxx11::string::compare((char *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  if (iVar3 == 0) {
    uVar4 = 0;
  }
  else {
    pcVar2 = (pGVar1->PrivilegedAxis).data_._M_dataplus._M_p;
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,pcVar2,pcVar2 + (pGVar1->PrivilegedAxis).data_._M_string_length);
    iVar3 = std::__cxx11::string::compare((char *)local_48);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
    if (iVar3 == 0) {
      uVar4 = 1;
    }
    else {
      pcVar2 = (pGVar1->PrivilegedAxis).data_._M_dataplus._M_p;
      local_48[0] = local_38;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_48,pcVar2,pcVar2 + (pGVar1->PrivilegedAxis).data_._M_string_length)
      ;
      iVar3 = std::__cxx11::string::compare((char *)local_48);
      if (local_48[0] != local_38) {
        operator_delete(local_48[0],local_38[0] + 1);
      }
      if (iVar3 != 0) {
        return;
      }
      uVar4 = 2;
    }
  }
  this->axis_ = uVar4;
  return;
}

Assistant:

NPAT::NPAT(SimInfo* info) : NPT(info) {
    Globals* simParams = info_->getSimParams();

    // Default value of privilegedAxis is "z"
    if (simParams->getPrivilegedAxis() == "x")
      axis_ = 0;
    else if (simParams->getPrivilegedAxis() == "y")
      axis_ = 1;
    else if (simParams->getPrivilegedAxis() == "z")
      axis_ = 2;
  }